

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Engine.cpp
# Opt level: O2

string * __thiscall
adios2::core::engine::BP5Engine::GetBPMetadataIndexFileName
          (string *__return_storage_ptr__,BP5Engine *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string bpName;
  
  helper::RemoveTrailingSlash(&bpName,name);
  std::operator+(&local_50,&bpName,'/');
  std::operator+(__return_storage_ptr__,&local_50,"md.idx");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&bpName);
  return __return_storage_ptr__;
}

Assistant:

std::string BP5Engine::GetBPMetadataIndexFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    /* the name of the metadata index file is "md.idx" */
    const std::string bpMetaDataIndexRankName(bpName + PathSeparator + "md.idx");
    return bpMetaDataIndexRankName;
}